

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::setIdentifier(CommonCore *this,string_view name)

{
  string_view message;
  BrokerState BVar1;
  undefined8 uVar2;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  pbVar3 = in_RDI;
  BVar1 = BrokerBase::getBrokerState((BrokerBase *)0x540ce6);
  if (BVar1 == CREATED) {
    std::__cxx11::string::operator=(in_RDI,in_stack_ffffffffffffffc8);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  message._M_str = in_RSI;
  message._M_len = (size_t)pbVar3;
  InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_stack_ffffffffffffffe0,message)
  ;
  __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
}

Assistant:

void CommonCore::setIdentifier(std::string_view name)
{
    if (getBrokerState() == BrokerState::CREATED) {
        identifier = name;
    } else {
        throw(
            InvalidFunctionCall("setIdentifier can only be called before the core is initialized"));
    }
}